

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

Constraint *
slang::ast::ForeachConstraint::fromSyntax(LoopConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  Scope *pSVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  Expression *args;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForeachConstraint *pFVar5;
  size_type sVar6;
  EVP_PKEY_CTX *src;
  size_type sVar7;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  ASTContext iterCtx;
  span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_f0;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> local_e0 [2];
  ASTContext local_68;
  
  this = ((context->scope).ptr)->compilation;
  local_68.assertionInstance = context->assertionInstance;
  local_68.scope.ptr = (context->scope).ptr;
  local_68.lookupIndex = context->lookupIndex;
  local_68._12_4_ = *(undefined4 *)&context->field_0xc;
  local_68.flags.m_bits = (context->flags).m_bits;
  local_68.instanceOrProc = context->instanceOrProc;
  local_68.firstTempVar = context->firstTempVar;
  local_68.randomizeDetails = context->randomizeDetails;
  local_e0[0].len = 0;
  local_e0[0].cap = 4;
  local_e0[0].data_ = (pointer)local_e0[0].firstElement;
  args = ForeachLoopStatement::buildLoopDims((syntax->loopList).ptr,&local_68,local_e0);
  if (args == (Expression *)0x0) {
    local_f0._M_ptr = (pointer)0x0;
    pFVar5 = (ForeachConstraint *)
             BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
                       (&this->super_BumpAllocator,(Constraint **)&local_f0);
  }
  else {
    sVar6 = local_e0[0].len;
    if (local_e0[0].len != 0) {
      pSVar1 = (context->scope).ptr;
      sVar6 = local_e0[0].len * 0x18;
      sVar7 = 0;
      do {
        lVar2 = *(long *)((long)&(local_e0[0].data_)->loopVar + sVar7);
        if (lVar2 != 0) {
          *(Scope **)(lVar2 + 0x20) = pSVar1;
        }
        sVar7 = sVar7 + 0x18;
      } while (sVar6 != sVar7);
    }
    iVar3 = Constraint::bind((int)(syntax->constraints).ptr,(sockaddr *)&local_68,(socklen_t)sVar6);
    iVar4 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::copy
                      (local_e0,(EVP_PKEY_CTX *)this,src);
    local_f0._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar4);
    pFVar5 = BumpAllocator::
             emplace<slang::ast::ForeachConstraint,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Constraint_const&>
                       (&this->super_BumpAllocator,args,&local_f0,
                        (Constraint *)CONCAT44(extraout_var,iVar3));
    if (((Constraint *)CONCAT44(extraout_var,iVar3))->kind == Invalid) {
      local_f0._M_ptr = (pointer)pFVar5;
      pFVar5 = (ForeachConstraint *)
               BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
                         (&this->super_BumpAllocator,(Constraint **)&local_f0);
    }
  }
  if (local_e0[0].data_ != (pointer)local_e0[0].firstElement) {
    operator_delete(local_e0[0].data_);
  }
  return &pFVar5->super_Constraint;
}

Assistant:

Constraint& ForeachConstraint::fromSyntax(const LoopConstraintSyntax& syntax,
                                          const ASTContext& context) {
    auto& comp = context.getCompilation();

    ASTContext iterCtx = context;
    SmallVector<ForeachLoopStatement::LoopDim, 4> dims;
    auto arrayRef = ForeachLoopStatement::buildLoopDims(*syntax.loopList, iterCtx, dims);
    if (!arrayRef)
        return badConstraint(comp, nullptr);

    // Set the parent pointer on the iterator variables in case
    // someone inspects them later. We just created these in the
    // method above so the const_cast is safe.
    for (auto& dim : dims) {
        if (dim.loopVar)
            const_cast<IteratorSymbol*>(dim.loopVar)->setParent(*context.scope);
    }

    auto& body = Constraint::bind(*syntax.constraints, iterCtx);
    auto result = comp.emplace<ForeachConstraint>(*arrayRef, dims.copy(comp), body);
    if (body.bad())
        return badConstraint(comp, result);

    return *result;
}